

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemmtest.c
# Opt level: O2

void test(int data_type)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  void *__ptr;
  ulong uVar5;
  DoubleComplex *pDVar6;
  DoubleComplex *pDVar7;
  DoublePrecision DVar8;
  long lVar9;
  char *__format;
  size_t __size;
  bool bVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  long lVar15;
  void *local_f8;
  int ld;
  void *local_e8;
  int hi [2];
  int lo [2];
  float beta_flt;
  void *local_c0;
  ulong local_b8;
  void *local_b0;
  long local_a8;
  float alpha_flt;
  SingleComplex beta_scpl;
  double beta_dbl;
  DoublePrecision local_88;
  ulong local_80;
  SingleComplex alpha_scpl;
  double alpha_dbl;
  DoubleComplex beta_dcpl;
  int dims [2];
  DoubleComplex alpha_dcpl;
  
  iVar1 = GA_Nodeid();
  GA_Nnodes();
  dims[0] = 8;
  dims[1] = 8;
  lo[0] = 0;
  lo[1] = 0;
  hi[0] = 7;
  hi[1] = 7;
  beta_dbl = 0.0;
  beta_flt = 0.0;
  alpha_dbl = 1.0;
  alpha_flt = 1.0;
  alpha_dcpl.real = 1.0;
  alpha_dcpl.imag = 0.0;
  beta_scpl.real = 0.0;
  beta_scpl.imag = 0.0;
  beta_dcpl.real = 0.0;
  beta_dcpl.imag = 0.0;
  alpha_scpl.real = 1.0;
  alpha_scpl.imag = 0.0;
  uVar12 = data_type - 0x3eb;
  switch(uVar12) {
  case 0:
    pvVar14 = malloc(0x100);
    local_f8 = malloc(0x100);
    local_c0 = malloc(0x100);
    if (iVar1 == 0) {
      __format = "Single Precision: Testing GA_Sgemm,NGA_Matmul_patch for %d-Dimension";
      break;
    }
LAB_001038dd:
    bVar10 = false;
    goto LAB_00103938;
  case 1:
    pvVar14 = malloc(0x200);
    local_f8 = malloc(0x200);
    local_c0 = malloc(0x200);
    if (iVar1 != 0) goto LAB_001038dd;
    __format = "Double Precision: Testing GA_Dgemm,NGA_Matmul_patch for %d-Dimension";
    break;
  default:
    GA_Error("wrong data type",data_type);
    local_c0 = (void *)0x0;
    local_f8 = (void *)0x0;
    pvVar14 = (void *)0x0;
    bVar10 = false;
    if (iVar1 != 0) goto LAB_00103938;
    goto LAB_00103929;
  case 3:
    pvVar14 = malloc(0x200);
    local_f8 = malloc(0x200);
    local_c0 = malloc(0x200);
    if (iVar1 != 0) goto LAB_001038dd;
    __format = "Single Complex:   Testing GA_Cgemm,NGA_Matmul_patch for %d-Dimension";
    break;
  case 4:
    pvVar14 = malloc(0x400);
    local_f8 = malloc(0x400);
    local_c0 = malloc(0x400);
    if (iVar1 != 0) goto LAB_001038dd;
    __format = "Double Complex:   Testing GA_Zgemm,NGA_Matmul_patch for %d-Dimension";
  }
  printf(__format,2);
LAB_00103929:
  puts("\nCreate A, B, C");
  bVar10 = true;
LAB_00103938:
  iVar1 = NGA_Create(data_type,2,dims,"array A",(int *)0x0);
  uVar2 = GA_Duplicate(iVar1,"array B");
  DVar8 = (DoublePrecision)(ulong)uVar2;
  uVar3 = GA_Duplicate(iVar1,"array C");
  uVar5 = (ulong)uVar3;
  if ((uVar2 == 0 || iVar1 == 0) || uVar3 == 0) {
    GA_Error("Create failed: a, b or c",1);
  }
  ld = 8;
  local_88 = DVar8;
  local_80 = uVar5;
  if (bVar10) {
    puts("\nInitialize A");
    lVar15 = (long)pvVar14 + 8;
    uVar5 = 0;
    lVar4 = 0;
    local_e8 = pvVar14;
    local_b0 = pvVar14;
    while (lVar4 != 8) {
      local_b8 = uVar5;
      local_a8 = lVar4;
      for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 4) {
        iVar11 = (int)uVar5;
        if (uVar12 < 5) {
          switch(uVar12) {
          case 0:
            *(float *)((long)local_e8 + lVar9) = (float)iVar11;
            break;
          case 1:
            *(double *)((long)pvVar14 + lVar9 * 2) = (double)iVar11;
            break;
          case 2:
            goto switchD_00103a2d_caseD_2;
          case 3:
            *(float *)((long)pvVar14 + lVar9 * 2) = (float)iVar11;
            *(undefined4 *)((long)pvVar14 + lVar9 * 2 + 4) = 0x3f800000;
            break;
          case 4:
            *(double *)(lVar15 + -8 + lVar9 * 4) = (double)iVar11;
            *(undefined8 *)(lVar15 + lVar9 * 4) = 0x3ff0000000000000;
          }
        }
        else {
switchD_00103a2d_caseD_2:
          GA_Error("wrong data type",data_type);
        }
        uVar5 = (ulong)(iVar11 + 1);
      }
      local_e8 = (void *)((long)local_e8 + 0x20);
      uVar5 = (ulong)((int)local_b8 + 8);
      pvVar14 = (void *)((long)pvVar14 + 0x40);
      lVar15 = lVar15 + 0x80;
      lVar4 = local_a8 + 1;
    }
    NGA_Put(iVar1,lo,hi,local_b0,&ld);
    GA_Sync();
    puts("\nInitialize B");
    lVar4 = (long)local_f8 + 8;
    local_e8 = local_f8;
    uVar5 = 0;
    pvVar14 = local_f8;
    while (DVar8 = local_88, uVar5 != 8) {
      uVar13 = uVar5 & 0xffffffff;
      local_b8 = uVar5;
      for (lVar15 = 0; lVar15 != 0x20; lVar15 = lVar15 + 4) {
        iVar11 = (int)uVar13;
        if (uVar12 < 5) {
          switch(uVar12) {
          case 0:
            *(float *)((long)local_e8 + lVar15) = (float)iVar11;
            break;
          case 1:
            *(double *)((long)pvVar14 + lVar15 * 2) = (double)iVar11;
            break;
          case 2:
            goto switchD_00103b36_caseD_2;
          case 3:
            *(float *)((long)pvVar14 + lVar15 * 2) = (float)iVar11;
            *(undefined4 *)((long)pvVar14 + lVar15 * 2 + 4) = 0x3f800000;
            break;
          case 4:
            *(double *)(lVar4 + -8 + lVar15 * 4) = (double)iVar11;
            *(undefined8 *)(lVar4 + lVar15 * 4) = 0x3ff0000000000000;
          }
        }
        else {
switchD_00103b36_caseD_2:
          GA_Error("wrong data type",data_type);
        }
        uVar13 = (ulong)(iVar11 + 8);
      }
      local_e8 = (void *)((long)local_e8 + 0x20);
      pvVar14 = (void *)((long)pvVar14 + 0x40);
      lVar4 = lVar4 + 0x80;
      uVar5 = local_b8 + 1;
    }
    NGA_Put(SUB84(local_88,0),lo,hi,local_f8,&ld);
    GA_Sync();
    puts("\nPerform matrix multiply");
    uVar5 = local_80;
    pvVar14 = local_b0;
  }
  else {
    GA_Sync();
    GA_Sync();
  }
  __ptr = local_c0;
  if (uVar12 < 5) {
    switch(uVar12) {
    case 0:
      pDVar7 = (DoubleComplex *)&alpha_flt;
      pDVar6 = (DoubleComplex *)&beta_flt;
      break;
    case 1:
      pDVar7 = (DoubleComplex *)&alpha_dbl;
      pDVar6 = (DoubleComplex *)&beta_dbl;
      break;
    case 2:
      goto switchD_00103c15_caseD_2;
    case 3:
      pDVar7 = (DoubleComplex *)&alpha_scpl;
      pDVar6 = (DoubleComplex *)&beta_scpl;
      break;
    case 4:
      pDVar7 = &alpha_dcpl;
      pDVar6 = &beta_dcpl;
    }
    NGA_Matmul_patch('N','N',pDVar7,pDVar6,iVar1,lo,hi,SUB84(DVar8,0),lo,hi,(int)uVar5,lo,hi);
  }
  else {
switchD_00103c15_caseD_2:
    GA_Error("wrong data type",data_type);
  }
  GA_Sync();
  free(pvVar14);
  free(local_f8);
  free(__ptr);
  switch(uVar12) {
  case 0:
    __size = 0x40;
    pvVar14 = malloc(0x40);
    local_f8 = malloc(0x40);
    break;
  case 1:
  case 3:
    pvVar14 = malloc(0x80);
    local_f8 = malloc(0x80);
    __size = 0x80;
    break;
  default:
    GA_Error("wrong data type",data_type);
    goto LAB_00103d30;
  case 4:
    pvVar14 = malloc(0x100);
    local_f8 = malloc(0x100);
    __size = 0x100;
  }
  __ptr = malloc(__size);
LAB_00103d30:
  GA_Zero(iVar1);
  GA_Zero(SUB84(DVar8,0));
  GA_Zero((int)uVar5);
  if (bVar10) {
    local_c0 = __ptr;
    puts("\nTest patch multiply");
    lo[0] = 2;
    lo[1] = 2;
    hi[0] = 5;
    hi[1] = 5;
    ld = 4;
    puts("\nInitialize A");
    lVar4 = (long)pvVar14 + 8;
    iVar11 = 0x12;
    uVar5 = 2;
    local_e8 = pvVar14;
    local_b0 = pvVar14;
    while (uVar5 != 6) {
      local_a8 = CONCAT44(local_a8._4_4_,iVar11);
      local_b8 = uVar5;
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 4) {
        if (uVar12 < 5) {
          switch(uVar12) {
          case 0:
            *(float *)((long)local_e8 + lVar15) = (float)iVar11;
            break;
          case 1:
            *(double *)((long)pvVar14 + lVar15 * 2) = (double)iVar11;
            break;
          case 2:
            goto switchD_00103dee_caseD_2;
          case 3:
            *(float *)((long)pvVar14 + lVar15 * 2) = (float)iVar11;
            *(undefined4 *)((long)pvVar14 + lVar15 * 2 + 4) = 0x3f800000;
            break;
          case 4:
            *(double *)(lVar4 + -8 + lVar15 * 4) = (double)iVar11;
            *(undefined8 *)(lVar4 + lVar15 * 4) = 0x3ff0000000000000;
          }
        }
        else {
switchD_00103dee_caseD_2:
          GA_Error("wrong data type",data_type);
        }
        iVar11 = iVar11 + 1;
      }
      local_e8 = (void *)((long)local_e8 + 0x10);
      pvVar14 = (void *)((long)pvVar14 + 0x20);
      lVar4 = lVar4 + 0x40;
      iVar11 = (int)local_a8 + 8;
      uVar5 = local_b8 + 1;
    }
    NGA_Put(iVar1,lo,hi,local_b0,&ld);
    GA_Sync();
    puts("\nInitialize B");
    lVar4 = (long)local_f8 + 8;
    iVar11 = 0x12;
    local_e8 = local_f8;
    uVar5 = 2;
    pvVar14 = local_f8;
    while (DVar8 = local_88, uVar5 != 6) {
      local_a8 = CONCAT44(local_a8._4_4_,iVar11);
      local_b8 = uVar5;
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 4) {
        if (uVar12 < 5) {
          switch(uVar12) {
          case 0:
            *(float *)((long)local_e8 + lVar15) = (float)iVar11;
            break;
          case 1:
            *(double *)((long)pvVar14 + lVar15 * 2) = (double)iVar11;
            break;
          case 2:
            goto switchD_00103f23_caseD_2;
          case 3:
            *(float *)((long)pvVar14 + lVar15 * 2) = (float)iVar11;
            *(undefined4 *)((long)pvVar14 + lVar15 * 2 + 4) = 0x3f800000;
            break;
          case 4:
            *(double *)(lVar4 + -8 + lVar15 * 4) = (double)iVar11;
            *(undefined8 *)(lVar4 + lVar15 * 4) = 0x3ff0000000000000;
          }
        }
        else {
switchD_00103f23_caseD_2:
          GA_Error("wrong data type",data_type);
        }
        iVar11 = iVar11 + 8;
      }
      local_e8 = (void *)((long)local_e8 + 0x10);
      pvVar14 = (void *)((long)pvVar14 + 0x20);
      lVar4 = lVar4 + 0x40;
      iVar11 = (int)local_a8 + 1;
      uVar5 = local_b8 + 1;
    }
    NGA_Put(SUB84(local_88,0),lo,hi,local_f8,&ld);
    GA_Sync();
    beta_flt = 0.0;
    beta_dbl = 0.0;
    beta_scpl = (SingleComplex)((ulong)beta_scpl & 0xffffffff00000000);
    beta_dcpl.real = 0.0;
    puts("\nPerform matrix multiply on sub-blocks");
    __ptr = local_c0;
    pvVar14 = local_b0;
  }
  else {
    lo[0] = 2;
    lo[1] = 2;
    hi[0] = 5;
    hi[1] = 5;
    ld = 4;
    GA_Sync();
    GA_Sync();
    beta_flt = 0.0;
    beta_dbl = 0.0;
    beta_scpl = (SingleComplex)((ulong)beta_scpl & 0xffffffff00000000);
    beta_dcpl.real = 0.0;
  }
  iVar11 = (int)local_80;
  switch(uVar12) {
  case 0:
    pDVar7 = (DoubleComplex *)&alpha_flt;
    pDVar6 = (DoubleComplex *)&beta_flt;
    break;
  case 1:
    pDVar7 = (DoubleComplex *)&alpha_dbl;
    pDVar6 = (DoubleComplex *)&beta_dbl;
    break;
  default:
    GA_Error("wrong data type",data_type);
    goto LAB_001040b4;
  case 3:
    pDVar7 = (DoubleComplex *)&alpha_scpl;
    pDVar6 = (DoubleComplex *)&beta_scpl;
    break;
  case 4:
    pDVar7 = &alpha_dcpl;
    pDVar6 = &beta_dcpl;
  }
  NGA_Matmul_patch('N','N',pDVar7,pDVar6,iVar1,lo,hi,SUB84(DVar8,0),lo,hi,iVar11,lo,hi);
LAB_001040b4:
  GA_Sync();
  free(pvVar14);
  free(local_f8);
  free(__ptr);
  GA_Destroy(iVar1);
  GA_Destroy(SUB84(DVar8,0));
  GA_Destroy(iVar11);
  return;
}

Assistant:

void
test(int data_type) {
  int me=GA_Nodeid();
  int nproc = GA_Nnodes();
  int g_a, g_b, g_c;
  int ndim = 2;
  int dims[2]={N,N};
  int lo[2]={0,0};
  int hi[2]={N-1,N-1};
  int block_size[2]={NB,NB-1};
  int proc_grid[2];
  int i,j,l,k,m,n, ld;

  double alpha_dbl = 1.0, beta_dbl = 0.0;
  double dzero = 0.0;
  double ddiff;

  float alpha_flt = 1.0, beta_flt = 0.0;
  float fzero = 0.0;
  float fdiff;
  float ftmp;
  double dtmp;
  SingleComplex ctmp;
  DoubleComplex ztmp;

  DoubleComplex alpha_dcpl = {1.0, 0.0} , beta_dcpl = {0.0, 0.0}; 
  DoubleComplex zzero = {0.0,0.0};
  DoubleComplex zdiff;

  SingleComplex alpha_scpl = {1.0, 0.0} , beta_scpl = {0.0, 0.0}; 
  SingleComplex czero = {0.0,0.0};
  SingleComplex cdiff;

  void *alpha=NULL, *beta=NULL;
  void *abuf=NULL, *bbuf=NULL, *cbuf=NULL, *c_ptr=NULL;

  switch (data_type) {
  case C_FLOAT:
    alpha  = (void *)&alpha_flt;
    beta   = (void *)&beta_flt;
    abuf = (void*)malloc(N*N*sizeof(float));
    bbuf = (void*)malloc(N*N*sizeof(float));
    cbuf = (void*)malloc(N*N*sizeof(float));
    if(me==0) printf("Single Precision: Testing GA_Sgemm,NGA_Matmul_patch for %d-Dimension", ndim);
    break;      
  case C_DBL:
    alpha  = (void *)&alpha_dbl;
    beta   = (void *)&beta_dbl;
    abuf = (void*)malloc(N*N*sizeof(double));
    bbuf = (void*)malloc(N*N*sizeof(double));
    cbuf = (void*)malloc(N*N*sizeof(double));
    if(me==0) printf("Double Precision: Testing GA_Dgemm,NGA_Matmul_patch for %d-Dimension", ndim); 
    break;    
  case C_DCPL:
    alpha  = (void *)&alpha_dcpl;
    beta   = (void *)&beta_dcpl;
    abuf = (void*)malloc(N*N*sizeof(DoubleComplex));
    bbuf = (void*)malloc(N*N*sizeof(DoubleComplex));
    cbuf = (void*)malloc(N*N*sizeof(DoubleComplex));
    if(me==0) printf("Double Complex:   Testing GA_Zgemm,NGA_Matmul_patch for %d-Dimension", ndim);
    break;
  case C_SCPL:
    alpha  = (void *)&alpha_scpl;
    beta   = (void *)&beta_scpl;
    abuf = (void*)malloc(N*N*sizeof(SingleComplex));
    bbuf = (void*)malloc(N*N*sizeof(SingleComplex));
    cbuf = (void*)malloc(N*N*sizeof(SingleComplex));
    if(me==0) printf("Single Complex:   Testing GA_Cgemm,NGA_Matmul_patch for %d-Dimension", ndim);
    break;
  default:
    GA_Error("wrong data type", data_type);
  }

  if (me==0) printf("\nCreate A, B, C\n");
#ifdef USE_REGULAR
  g_a = NGA_Create(data_type, ndim, dims, "array A", NULL);
#endif
#ifdef USE_SIMPLE_CYCLIC
  g_a = NGA_Create_handle();
  NGA_Set_data(g_a,ndim,dims,data_type);
  NGA_Set_array_name(g_a,"array A");
  NGA_Set_block_cyclic(g_a,block_size);
  if (!GA_Allocate(g_a)) {
    GA_Error("Failed: create: g_a",40);
  }
#endif
#ifdef USE_SCALAPACK
  g_a = NGA_Create_handle();
  NGA_Set_data(g_a,ndim,dims,data_type);
  NGA_Set_array_name(g_a,"array A");
  grid_factor(nproc,&i,&j);
  proc_grid[0] = i;
  proc_grid[1] = j;
  NGA_Set_block_cyclic_proc_grid(g_a,block_size,proc_grid);
  if (!GA_Allocate(g_a)) {
    GA_Error("Failed: create: g_a",40);
  }
#endif
#ifdef USE_TILED
  g_a = NGA_Create_handle();
  NGA_Set_data(g_a,ndim,dims,data_type);
  NGA_Set_array_name(g_a,"array A");
  grid_factor(nproc,&i,&j);
  proc_grid[0] = i;
  proc_grid[1] = j;
  NGA_Set_tiled_proc_grid(g_a,block_size,proc_grid);
  if (!GA_Allocate(g_a)) {
    GA_Error("Failed: create: g_a",40);
  }
#endif
  g_b = GA_Duplicate(g_a, "array B");  
  g_c = GA_Duplicate(g_a, "array C");
  if(!g_a || !g_b || !g_c) GA_Error("Create failed: a, b or c",1);

  ld = N;
  if (me==0) printf("\nInitialize A\n");
  /* Set up matrix A */
  if (me == 0) {
    for (i=0; i<N; i++) {
      for (j=0; j<N; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)abuf)[i*N+j] = (float)(i*N+j);
            break;
          case C_DBL:
            ((double*)abuf)[i*N+j] = (double)(i*N+j);
            break;
          case C_DCPL:
            ((DoubleComplex*)abuf)[i*N+j].real = (double)(i*N+j);
            ((DoubleComplex*)abuf)[i*N+j].imag = 1.0;
            break;
          case C_SCPL:
            ((SingleComplex*)abuf)[i*N+j].real = (float)(i*N+j);
            ((SingleComplex*)abuf)[i*N+j].imag = 1.0;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
    NGA_Put(g_a,lo,hi,abuf,&ld);
  }
  GA_Sync();

  if (me==0) printf("\nInitialize B\n");
  /* Set up matrix B */
  if (me == 0) {
    for (i=0; i<N; i++) {
      for (j=0; j<N; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)bbuf)[i*N+j] = (float)(j*N+i);
            break;
          case C_DBL:
            ((double*)bbuf)[i*N+j] = (double)(j*N+i);
            break;
          case C_DCPL:
            ((DoubleComplex*)bbuf)[i*N+j].real = (double)(j*N+i);
            ((DoubleComplex*)bbuf)[i*N+j].imag = 1.0;
            break;
          case C_SCPL:
            ((SingleComplex*)bbuf)[i*N+j].real = (float)(j*N+i);
            ((SingleComplex*)bbuf)[i*N+j].imag = 1.0;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
    NGA_Put(g_b,lo,hi,bbuf,&ld);
  }
  GA_Sync();

  if (me==0) printf("\nPerform matrix multiply\n");
  switch (data_type) {
    case C_FLOAT:
      NGA_Matmul_patch('N','N',&alpha_flt,&beta_flt,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_DBL:
      NGA_Matmul_patch('N','N',&alpha_dbl,&beta_dbl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_SCPL:
      NGA_Matmul_patch('N','N',&alpha_scpl,&beta_scpl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_DCPL:
      NGA_Matmul_patch('N','N',&alpha_dcpl,&beta_dcpl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
  GA_Sync();
#if 0
  if (me==0) printf("\nCheck answer\n");
  /*
  GA_Print(g_a);
  if (me == 0) printf("\n\n\n\n");
  GA_Print(g_b);
  if (me == 0) printf("\n\n\n\n");
  GA_Print(g_c); 
  */

  /* Check answer */
  NGA_Get(g_a,lo,hi,abuf,&ld);
  NGA_Get(g_b,lo,hi,bbuf,&ld);
  for (i=0; i<N; i++) {
    for (j=0; j<N; j++) {
      switch (data_type) {
        case C_FLOAT:
          ((float*)cbuf)[i*N+j] = fzero;
          break;
        case C_DBL:
          ((double*)cbuf)[i*N+j] = dzero;
          break;
        case C_DCPL:
          ((DoubleComplex*)cbuf)[i*N+j] = zzero;
          break;
        case C_SCPL:
          ((SingleComplex*)cbuf)[i*N+j] = czero;
          break;
        default:
          GA_Error("wrong data type", data_type);
      }
      for (k=0; k<N; k++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)cbuf)[i*N+j] += ((float*)abuf)[i*N+k]
              *((float*)bbuf)[k*N+j];
            break;
          case C_DBL:
            ((double*)cbuf)[i*N+j] += ((double*)abuf)[i*N+k]
              *((double*)bbuf)[k*N+j];
            break;
          case C_DCPL:
            ((DoubleComplex*)cbuf)[i*N+j].real +=
              (((DoubleComplex*)abuf)[i*N+k].real
               *((DoubleComplex*)bbuf)[k*N+j].real
               -(((DoubleComplex*)abuf)[i*N+k].imag
                 *((DoubleComplex*)bbuf)[k*N+j].imag));
            ((DoubleComplex*)cbuf)[i*N+j].imag +=
              (((DoubleComplex*)abuf)[i*N+k].real
               *((DoubleComplex*)bbuf)[k*N+j].imag
               +(((DoubleComplex*)abuf)[i*N+k].imag
                 *((DoubleComplex*)bbuf)[k*N+j].real));
            break;
          case C_SCPL:
            ((SingleComplex*)cbuf)[i*N+j].real +=
              (((SingleComplex*)abuf)[i*N+k].real
               *((SingleComplex*)bbuf)[k*N+j].real
               -(((SingleComplex*)abuf)[i*N+k].imag
                 *((SingleComplex*)bbuf)[k*N+j].imag));
            ((SingleComplex*)cbuf)[i*N+j].imag +=
              (((SingleComplex*)abuf)[i*N+k].real
               *((SingleComplex*)bbuf)[k*N+j].imag
               +(((SingleComplex*)abuf)[i*N+k].imag
                 *((SingleComplex*)bbuf)[k*N+j].real));
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
  }
  GA_Sync();
  if (me == 0) {
    NGA_Get(g_c,lo,hi,abuf,&ld);
    for (i=0; i<N; i++) {
      for (j=0; j<N; j++) {
        switch (data_type) {
          case C_FLOAT:
            fdiff = ((float*)abuf)[i*N+j]-((float*)cbuf)[i*N+j];
            if (((float*)abuf)[i*N+j] != 0.0) {
              fdiff /= ((float*)abuf)[i*N+j];
            }
            if (fabs(fdiff) > TOLERANCE) {
              printf("p[%d] [%d,%d] Actual: %f Expected: %f\n",me,i,j,
                  ((float*)abuf)[i*N+j],((float*)cbuf)[i*N+j]);
            }
            break;
          case C_DBL:
            ddiff = ((double*)abuf)[i*N+j]-((double*)cbuf)[i*N+j];
            if (((double*)abuf)[i*N+j] != 0.0) {
              ddiff /= ((double*)abuf)[i*N+j];
            }
            if (fabs(ddiff) > TOLERANCE) {
              printf("p[%d] [%d,%d] Actual: %f Expected: %f\n",me,i,j,
                  ((double*)abuf)[i*N+j],((double*)cbuf)[i*N+j]);
            }
            break;
          case C_DCPL:
            zdiff.real = ((DoubleComplex*)abuf)[i*N+j].real
              -((DoubleComplex*)cbuf)[i*N+j].real;
            zdiff.imag = ((DoubleComplex*)abuf)[i*N+j].imag
              -((DoubleComplex*)cbuf)[i*N+j].imag;
            if (((DoubleComplex*)abuf)[i*N+j].real != 0.0 ||
                ((DoubleComplex*)abuf)[i*N+j].imag != 0.0) {
              ztmp = ((DoubleComplex*)abuf)[i*N+j];
              ddiff = sqrt((zdiff.real*zdiff.real+zdiff.imag*zdiff.imag)
                  /(ztmp.real*ztmp.real+ztmp.imag*ztmp.imag));
            } else {
              ddiff = sqrt(zdiff.real*zdiff.real+zdiff.imag*zdiff.imag);
            }
            if (fabs(ddiff) > TOLERANCE) {
              printf("p[%d] [%d,%d] Actual: (%f,%f) Expected: (%f,%f)\n",me,i,j,
                  ((DoubleComplex*)abuf)[i*N+j].real,
                  ((DoubleComplex*)abuf)[i*N+j].imag,
                  ((DoubleComplex*)cbuf)[i*N+j].real,
                  ((DoubleComplex*)cbuf)[i*N+j].imag);
            }
            break;
          case C_SCPL:
            cdiff.real = ((SingleComplex*)abuf)[i*N+j].real
              -((SingleComplex*)cbuf)[i*N+j].real;
            cdiff.imag = ((SingleComplex*)abuf)[i*N+j].imag
              -((SingleComplex*)cbuf)[i*N+j].imag;
            if (((SingleComplex*)abuf)[i*N+j].real != 0.0 ||
                ((SingleComplex*)abuf)[i*N+j].imag != 0.0) {
              ctmp = ((SingleComplex*)abuf)[i*N+j];
              fdiff = sqrt((cdiff.real*cdiff.real+cdiff.imag*cdiff.imag)
                  /(ctmp.real*ctmp.real+ctmp.imag*ctmp.imag));
            } else {
              fdiff = sqrt(cdiff.real*cdiff.real+cdiff.imag*cdiff.imag);
            }
            if (fabs(fdiff) > TOLERANCE) {
              printf("p[%d] [%d,%d] Actual: (%f,%f) Expected: (%f,%f)\n",me,i,j,
                  ((SingleComplex*)abuf)[i*N+j].real,
                  ((SingleComplex*)abuf)[i*N+j].imag,
                  ((SingleComplex*)cbuf)[i*N+j].real,
                  ((SingleComplex*)cbuf)[i*N+j].imag);
            }
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
  }
  GA_Sync();

  /* copy cbuf back to g_a */
  if (me == 0) {
    NGA_Put(g_a,lo,hi,cbuf,&ld);
  }
  GA_Sync();

  /* Get norm of g_a */
  switch (data_type) {
    case C_FLOAT:
      ftmp = GA_Fdot(g_a,g_a);
      break;
    case C_DBL:
      dtmp = GA_Ddot(g_a,g_a);
      break;
    case C_DCPL:
      ztmp = GA_Zdot(g_a,g_a);
      break;
    case C_SCPL:
      ctmp = GA_Cdot(g_a,g_a);
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
  /* subtract C from A and put the results in B */
  beta_flt = -1.0;
  beta_dbl = -1.0;
  beta_scpl.real = -1.0;
  beta_dcpl.real = -1.0;
  GA_Zero(g_b);
  GA_Add(alpha,g_a,beta,g_c,g_b);
  /* evaluate the norm of the difference between the two matrices */
  switch (data_type) {
    case C_FLOAT:
      fdiff = GA_Fdot(g_b, g_b);
      if (ftmp != 0.0) {
        fdiff /= ftmp;
      }
      if(fabs(fdiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(fdiff), TOLERANCE);
        GA_Error("GA_Sgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Sgemm OK\n\n");
      }
      break;
    case C_DBL:
      ddiff = GA_Ddot(g_b, g_b);
      if (dtmp != 0.0) {
        ddiff /= dtmp;
      }
      if(fabs(ddiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(ddiff), TOLERANCE);
        GA_Error("GA_Dgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Dgemm OK\n\n");
      }
      break;
    case C_DCPL:
      zdiff = GA_Zdot(g_b, g_b);
      if (ztmp.real != 0.0 || ztmp.imag != 0.0) {
        ddiff = sqrt((zdiff.real*zdiff.real+zdiff.imag*zdiff.imag)
            /(ztmp.real*ztmp.real+ztmp.imag*ztmp.imag));
      } else {
        ddiff = sqrt(zdiff.real*zdiff.real+zdiff.imag*zdiff.imag);
      }
      if(fabs(ddiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(zdiff.real), TOLERANCE);
        GA_Error("GA_Zgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Zgemm OK\n\n");
      }
      break;
    case C_SCPL:
      cdiff = GA_Cdot(g_b, g_b);
      if (ctmp.real != 0.0 || ctmp.imag != 0.0) {
        fdiff = sqrt((cdiff.real*cdiff.real+cdiff.imag*cdiff.imag)
            /(ctmp.real*ctmp.real+ctmp.imag*ctmp.imag));
      } else {
        fdiff = sqrt(cdiff.real*cdiff.real+cdiff.imag*cdiff.imag);
      }
      if(fabs(fdiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(cdiff.real), TOLERANCE);
        GA_Error("GA_Cgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Cgemm OK\n\n");
      }
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
#endif

  free(abuf);
  free(bbuf);
  free(cbuf);

  switch (data_type) {
  case C_FLOAT:
    abuf = (void*)malloc(N*N*sizeof(float)/4);
    bbuf = (void*)malloc(N*N*sizeof(float)/4);
    cbuf = (void*)malloc(N*N*sizeof(float)/4);
    break;      
  case C_DBL:
    abuf = (void*)malloc(N*N*sizeof(double)/4);
    bbuf = (void*)malloc(N*N*sizeof(double)/4);
    cbuf = (void*)malloc(N*N*sizeof(double)/4);
    break;    
  case C_DCPL:
    abuf = (void*)malloc(N*N*sizeof(DoubleComplex)/4);
    bbuf = (void*)malloc(N*N*sizeof(DoubleComplex)/4);
    cbuf = (void*)malloc(N*N*sizeof(DoubleComplex)/4);
    break;
  case C_SCPL:
    abuf = (void*)malloc(N*N*sizeof(SingleComplex)/4);
    bbuf = (void*)malloc(N*N*sizeof(SingleComplex)/4);
    cbuf = (void*)malloc(N*N*sizeof(SingleComplex)/4);
    break;
  default:
    GA_Error("wrong data type", data_type);
  }

  /* Test multiply on a fraction of matrix. Start by reinitializing
   * A and B */
  GA_Zero(g_a);
  GA_Zero(g_b);
  GA_Zero(g_c);

  if (me==0) printf("\nTest patch multiply\n");

  lo[0] = N/4;
  lo[1] = N/4;
  hi[0] = 3*N/4-1;
  hi[1] = 3*N/4-1;
  ld = N/2;

  /* Set up matrix A */
  if (me==0) printf("\nInitialize A\n");
  if (me == 0) {
    for (i=N/4; i<3*N/4; i++) {
      for (j=N/4; j<3*N/4; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)abuf)[(i-N/4)*N/2+(j-N/4)] = (float)(i*N+j);
            break;
          case C_DBL:
            ((double*)abuf)[(i-N/4)*N/2+(j-N/4)] = (double)(i*N+j);
            break;
          case C_DCPL:
            ((DoubleComplex*)abuf)[(i-N/4)*N/2+(j-N/4)].real = (double)(i*N+j);
            ((DoubleComplex*)abuf)[(i-N/4)*N/2+(j-N/4)].imag = 1.0;
            break;
          case C_SCPL:
            ((SingleComplex*)abuf)[(i-N/4)*N/2+(j-N/4)].real = (float)(i*N+j);
            ((SingleComplex*)abuf)[(i-N/4)*N/2+(j-N/4)].imag = 1.0;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
    NGA_Put(g_a,lo,hi,abuf,&ld);
  }
  GA_Sync();

  if (me==0) printf("\nInitialize B\n");
  /* Set up matrix B */
  if (me == 0) {
    for (i=N/4; i<3*N/4; i++) {
      for (j=N/4; j<3*N/4; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)bbuf)[(i-N/4)*N/2+(j-N/4)] = (float)(j*N+i);
            break;
          case C_DBL:
            ((double*)bbuf)[(i-N/4)*N/2+(j-N/4)] = (double)(j*N+i);
            break;
          case C_DCPL:
            ((DoubleComplex*)bbuf)[(i-N/4)*N/2+(j-N/4)].real = (double)(j*N+i);
            ((DoubleComplex*)bbuf)[(i-N/4)*N/2+(j-N/4)].imag = 1.0;
            break;
          case C_SCPL:
            ((SingleComplex*)bbuf)[(i-N/4)*N/2+(j-N/4)].real = (float)(j*N+i);
            ((SingleComplex*)bbuf)[(i-N/4)*N/2+(j-N/4)].imag = 1.0;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
      }
    }
    NGA_Put(g_b,lo,hi,bbuf,&ld);
  }
  GA_Sync();

  beta_flt = 0.0;
  beta_dbl = 0.0;
  beta_scpl.real = 0.0;
  beta_dcpl.real = 0.0;
  if (me==0) printf("\nPerform matrix multiply on sub-blocks\n");
  switch (data_type) {
    case C_FLOAT:
      NGA_Matmul_patch('N','N',&alpha_flt,&beta_flt,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_DBL:
      NGA_Matmul_patch('N','N',&alpha_dbl,&beta_dbl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_SCPL:
      NGA_Matmul_patch('N','N',&alpha_scpl,&beta_scpl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    case C_DCPL:
      NGA_Matmul_patch('N','N',&alpha_dcpl,&beta_dcpl,g_a,lo,hi,
        g_b,lo,hi,g_c,lo,hi);
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
  GA_Sync();
#if 0
  if (0) {
  /*
  if (data_type != C_SCPL && data_type != C_DCPL) {
  */

  if (me==0) printf("\nCheck answer\n");

  /* Multiply buffers by hand */
  if (me == 0) {
    for (i=0; i<N/2; i++) {
      for (j=0; j<N/2; j++) {
        switch (data_type) {
          case C_FLOAT:
            ((float*)cbuf)[i*N/2+j] = fzero;
            break;
          case C_DBL:
            ((double*)cbuf)[i*N/2+j] = dzero;
            break;
          case C_DCPL:
            ((DoubleComplex*)cbuf)[i*N/2+j] = zzero;
            break;
          case C_SCPL:
            ((SingleComplex*)cbuf)[i*N/2+j] = czero;
            break;
          default:
            GA_Error("wrong data type", data_type);
        }
        for (k=0; k<N/2; k++) {
          switch (data_type) {
            case C_FLOAT:
              ((float*)cbuf)[i*N/2+j] += ((float*)abuf)[i*N/2+k]
                *((float*)bbuf)[k*N/2+j];
              break;
            case C_DBL:
              ((double*)cbuf)[i*N/2+j] += ((double*)abuf)[i*N/2+k]
                *((double*)bbuf)[k*N/2+j];
              break;
            case C_DCPL:
              ((DoubleComplex*)cbuf)[i*N/2+j].real +=
                (((DoubleComplex*)abuf)[i*N/2+k].real
                 *((DoubleComplex*)bbuf)[k*N/2+j].real
                 -(((DoubleComplex*)abuf)[i*N/2+k].imag
                   *((DoubleComplex*)bbuf)[k*N/2+j].imag));
              ((DoubleComplex*)cbuf)[i*N/2+j].imag +=
                (((DoubleComplex*)abuf)[i*N/2+k].real
                 *((DoubleComplex*)bbuf)[k*N/2+j].imag
                 +(((DoubleComplex*)abuf)[i*N/2+k].imag
                   *((DoubleComplex*)bbuf)[k*N/2+j].real));
              break;
            case C_SCPL:
              ((SingleComplex*)cbuf)[i*N/2+j].real +=
                (((SingleComplex*)abuf)[i*N/2+k].real
                 *((SingleComplex*)bbuf)[k*N/2+j].real
                 -(((SingleComplex*)abuf)[i*N/2+k].imag
                   *((SingleComplex*)bbuf)[k*N/2+j].imag));
              ((SingleComplex*)cbuf)[i*N/2+j].imag +=
                (((SingleComplex*)abuf)[i*N/2+k].real
                 *((SingleComplex*)bbuf)[k*N/2+j].imag
                 +(((SingleComplex*)abuf)[i*N/2+k].imag
                   *((SingleComplex*)bbuf)[k*N/2+j].real));
              break;
            default:
              GA_Error("wrong data type", data_type);
          }
        }
      }
    }
    NGA_Put(g_a,lo,hi,cbuf,&ld);
  }
  if (me == 0) printf("\n\n\n\n");

  /* Get norm of g_a */
  switch (data_type) {
    case C_FLOAT:
      ftmp = NGA_Fdot_patch(g_a,'N',lo,hi,g_a,'N',lo,hi);
      break;
    case C_DBL:
      dtmp = NGA_Ddot_patch(g_a,'N',lo,hi,g_a,'N',lo,hi);
      break;
    case C_DCPL:
      ztmp = NGA_Zdot_patch(g_a,'N',lo,hi,g_a,'N',lo,hi);
      break;
    case C_SCPL:
      ctmp = NGA_Cdot_patch(g_a,'N',lo,hi,g_a,'N',lo,hi);
      break;
    default:
      GA_Error("wrong data type", data_type);
  }
  /* subtract C from A and put the results in B */
  beta_flt = -1.0;
  beta_dbl = -1.0;
  beta_scpl.real = -1.0;
  beta_dcpl.real = -1.0;
  NGA_Zero_patch(g_b,lo,hi);
  NGA_Add_patch(alpha,g_a,lo,hi,beta,g_c,lo,hi,g_b,lo,hi);
  /* evaluate the norm of the difference between the two matrices */
  switch (data_type) {
    case C_FLOAT:
      fdiff = NGA_Fdot_patch(g_b,'N',lo,hi,g_b,'N',lo,hi);
      if (ftmp != 0.0) {
        fdiff /= ftmp;
      }
      if(fabs(fdiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(fdiff), TOLERANCE);
        GA_Error("GA_Sgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Sgemm OK\n\n");
      }
      break;
    case C_DBL:
      ddiff = NGA_Ddot_patch(g_b,'N',lo,hi,g_b,'N',lo,hi);
      if (dtmp != 0.0) {
        ddiff /= dtmp;
      }
      if(fabs(ddiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(ddiff), TOLERANCE);
        GA_Error("GA_Dgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Dgemm OK\n\n");
      }
      break;
    case C_DCPL:
      zdiff = NGA_Zdot_patch(g_b,'N',lo,hi,g_b,'N',lo,hi);
      if (ztmp.real != 0.0 || ztmp.imag != 0.0) {
        ddiff = sqrt((zdiff.real*zdiff.real+zdiff.imag*zdiff.imag)
            /(ztmp.real*ztmp.real+ztmp.imag*ztmp.imag));
      } else {
        ddiff = sqrt(zdiff.real*zdiff.real+zdiff.imag*zdiff.imag);
      }
      if(fabs(ddiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(zdiff.real), TOLERANCE);
        GA_Error("GA_Zgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Zgemm OK\n\n");
      }
      break;
    case C_SCPL:
      cdiff = NGA_Cdot_patch(g_b,'N',lo,hi,g_b,'N',lo,hi);
      if (ctmp.real != 0.0 || ctmp.imag != 0.0) {
        fdiff = sqrt((cdiff.real*cdiff.real+cdiff.imag*cdiff.imag)
            /(ctmp.real*ctmp.real+ctmp.imag*ctmp.imag));
      } else {
        fdiff = sqrt(cdiff.real*cdiff.real+cdiff.imag*cdiff.imag);
      }
      if(fabs(fdiff) > TOLERANCE) {
        printf("\nabs(result) = %f > %f\n", fabsf(cdiff.real), TOLERANCE);
        GA_Error("GA_Cgemm Failed", 1);
      } else if (me == 0) {
        printf("\nGA_Cgemm OK\n\n");
      }
      break;
    default:
      GA_Error("wrong data type", data_type);
  }

  }
#endif
  free(abuf);
  free(bbuf);
  free(cbuf);

  GA_Destroy(g_a);
  GA_Destroy(g_b);
  GA_Destroy(g_c);
}